

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj.c
# Opt level: O1

void objrevert(void *ctx0,mcmon objn)

{
  ushort *puVar1;
  ushort uVar2;
  ushort uVar3;
  uchar *puVar4;
  uint uVar5;
  
  puVar4 = mcmlck((mcmcxdef *)ctx0,objn);
  uVar2 = *(ushort *)(puVar4 + 2);
  uVar5 = *(uint *)(puVar4 + 10);
  *(uint *)(puVar4 + 6) = uVar5;
  if ((short)uVar5 != 0) {
    uVar5 = uVar5 & 0xffff;
    puVar4 = puVar4 + (ulong)*(ushort *)(puVar4 + 4) * 2 + 0xe;
    do {
      puVar4[5] = puVar4[5] & 0xfd;
      puVar4 = puVar4 + (ulong)*(ushort *)(puVar4 + 3) + 6;
      uVar5 = uVar5 - 1;
    } while (uVar5 != 0);
  }
  uVar3 = *(ushort *)
           (*(long *)((long)ctx0 + (ulong)(objn >> 8) * 8 + 0x30) + (ulong)(objn & 0xff) * 2);
  puVar1 = (ushort *)
           (*(long *)(**ctx0 + (ulong)(uVar3 >> 8) * 8) + 0x14 + (ulong)((uVar3 & 0xff) << 5));
  *puVar1 = *puVar1 | 1;
  mcmunlck((mcmcxdef *)ctx0,objn);
  if ((uVar2 & 2) == 0) {
    return;
  }
  objindx((mcmcxdef *)ctx0,objn);
  return;
}

Assistant:

void objrevert(void *ctx0, mcmon objn)
{
    mcmcxdef *mctx = (mcmcxdef *)ctx0;
    uchar    *p;
    prpdef   *pr;
    int       cnt;
    int       indexed;
    
    p = mcmlck(mctx, objn);
    pr = objprp(p);
    indexed = objflg(p) & OBJFINDEX;
    
    /* restore original settings */
    objsfree(p, objrst(p));
    objsnp(p, objstat(p));

    /* go through original properties and remove 'ignore' flag if set */
    for (cnt = objnprop(p) ; cnt ; pr = objpnxt(pr), --cnt)
        prpflg(pr) &= ~PRPFIGN;
    
    /* touch object and unlock it */
    mcmtch(mctx, objn);
    mcmunlck(mctx, objn);
    
    /* if it's indexed, rebuild the index */
    if (indexed) objindx(mctx, objn);
}